

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Session::useConfigData(Session *this,ConfigData *configData)

{
  ConfigData::operator=(&this->m_configData,configData);
  clara::std::__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void Session::useConfigData( ConfigData const& configData ) {
        m_configData = configData;
        m_config.reset();
    }